

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer::operator()
          (hex_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar1;
  
  bVar1 = internal::
          format_uint<4u,char,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,unsigned_long>
                    ((back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)
                     it->container,*(unsigned_long *)(*(long *)this + 0x10),*(int *)(this + 8),
                     *(char *)(*(long *)(*(long *)this + 8) + 0x11) != 'x');
  it->container = (list<char,_std::allocator<char>_> *)bVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }